

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O1

bool cmWhileCommand(vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
                   cmExecutionStatus *status)

{
  pointer *ppcVar1;
  pointer pcVar2;
  pointer pcVar3;
  cmMakefile *mf;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> this;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_50;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_48;
  
  pcVar2 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar2 == pcVar3) {
    ppcVar1 = &local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)ppcVar1) {
      operator_delete(local_48.
                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_48.
                                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value).
                                     _M_dataplus._M_p + 1));
    }
  }
  else {
    mf = status->Makefile;
    this.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         operator_new(0xb8);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector(&local_48,args);
    cmWhileFunctionBlocker::cmWhileFunctionBlocker
              ((cmWhileFunctionBlocker *)
               this.
               super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
               super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl,mf,&local_48);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_48);
    local_50._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         this.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
         super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
    cmMakefile::AddFunctionBlocker
              (mf,(unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                  &local_50);
    if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
        local_50._M_t.
        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
        super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0)
    {
      (**(code **)(*(long *)local_50._M_t.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))();
    }
  }
  return pcVar2 != pcVar3;
}

Assistant:

bool cmWhileCommand(std::vector<cmListFileArgument> const& args,
                    cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // create a function blocker
  auto& makefile = status.GetMakefile();
  makefile.AddFunctionBlocker(
    cm::make_unique<cmWhileFunctionBlocker>(&makefile, args));

  return true;
}